

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peer.cpp
# Opt level: O1

void __thiscall Peer::disconnect(Peer *this,bool suppressException)

{
  long lVar1;
  Socket __fd;
  int iVar2;
  Events *this_00;
  unique_ptr<Event,_std::default_delete<Event>_> *puVar3;
  Peers *this_01;
  undefined8 *puVar4;
  long *plVar5;
  int *piVar6;
  long *plVar7;
  ulong *puVar8;
  ulong *local_d0;
  undefined8 local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __fd = SocketResource::resource(&this->m_socket);
  iVar2 = shutdown(__fd,2);
  if (iVar2 != -1 || suppressException) {
    this->m_connected = false;
    this_00 = P2PSocket::events(this->m_master);
    puVar3 = Events::onPeerDisconnect(this_00);
    Event::trigger<Peer*>
              ((puVar3->_M_t).super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
               super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
               super__Head_base<0UL,_Event_*,_false>._M_head_impl,this);
    this_01 = P2PSocket::peers(this->m_master);
    Peers::remove(this_01,(char *)this);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x20);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Failed to shutdown socket to peer ","");
  std::operator+(&local_50,&local_70,&this->m_name);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = (long *)*plVar5;
  plVar7 = plVar5 + 2;
  if (local_b0 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar5[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  piVar6 = __errno_location();
  strerror(*piVar6);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_90 = (long *)*plVar5;
  plVar7 = plVar5 + 2;
  if (local_90 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_d0 = (ulong *)*plVar5;
  puVar8 = (ulong *)(plVar5 + 2);
  if (local_d0 == puVar8) {
    local_c0 = *puVar8;
    uStack_b8 = (undefined4)plVar5[3];
    uStack_b4 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar8;
  }
  lVar1 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  *puVar4 = puVar4 + 2;
  if (local_d0 == &local_c0) {
    *(undefined4 *)(puVar4 + 2) = (undefined4)local_c0;
    *(undefined4 *)((long)puVar4 + 0x14) = local_c0._4_4_;
    *(undefined4 *)(puVar4 + 3) = uStack_b8;
    *(undefined4 *)((long)puVar4 + 0x1c) = uStack_b4;
  }
  else {
    *puVar4 = local_d0;
    puVar4[2] = local_c0;
  }
  puVar4[1] = lVar1;
  local_c0 = local_c0 & 0xffffffffffffff00;
  __cxa_throw(puVar4,&PeerException::typeinfo,PeerException::~PeerException);
}

Assistant:

void Peer::disconnect(bool suppressException)
{
    int shutdown = ::shutdown(m_socket.resource(), SHUT_RDWR);
    if (shutdown == -1 && !suppressException) {
        throw PeerException(std::string{"Failed to shutdown socket to peer "} + m_name + " " +
                            std::strerror(errno) + "\n");
    }

    // Don't call close here, it will be triggered automatically when object gets destroyed
    m_connected = false;
    this->m_master->events()->onPeerDisconnect()->trigger(this);
    this->m_master->peers()->remove(this);
}